

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

ssize_t __thiscall
CVmByteArraySource::read(CVmByteArraySource *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  unsigned_long unaff_retaddr;
  uchar *in_stack_00000008;
  size_t copied;
  size_t rdlen;
  
  pvVar1 = (void *)CVmObjByteArray::copy_to_buf
                             ((CVmObjByteArray *)copied,in_stack_00000008,unaff_retaddr,(size_t)this
                             );
  this->idx = (long)pvVar1 + this->idx;
  return (ulong)(pvVar1 != __buf);
}

Assistant:

virtual int read(void *buf, size_t len)
    {
        /* limit the read to the available length */
        size_t rdlen = (idx + (long)len > end_idx
                        ? (size_t)(end_idx - idx) : len);

        /* copy the requested bytes starting at the current index */
        size_t copied = arr->copy_to_buf((unsigned char *)buf, idx + 1, rdlen);

        /* move past the bytes copied */
        idx += copied;

        /* we were successful if we copied exactly the requested length */
        return copied != len;
    }